

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O1

void BM_vlog(int n)

{
  bool bVar1;
  ostream *poVar2;
  int iVar3;
  LogMessage local_90;
  
  if (0 < n) {
    iVar3 = n + 1;
    do {
      if (BM_vlog::vlocal__.level == (int32 *)0x0) {
        bVar1 = google::InitVLOG3__(&BM_vlog::vlocal__,&fLI::FLAGS_v,
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                                    ,1);
      }
      else {
        bVar1 = 0 < *BM_vlog::vlocal__.level;
      }
      if (bVar1 != false) {
        google::LogMessage::LogMessage
                  (&local_90,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                   ,0xb6);
        poVar2 = google::LogMessage::stream(&local_90);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"test message",0xc);
        if (bVar1 != false) {
          google::LogMessage::~LogMessage(&local_90);
        }
      }
      iVar3 = iVar3 + -1;
    } while (1 < iVar3);
  }
  return;
}

Assistant:

static void BM_vlog(int n) {
  while (n-- > 0) {
    VLOG(1) << "test message";
  }
}